

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall
aeron::ClientConductor::onSubscriptionReady
          (ClientConductor *this,int64_t registrationId,int32_t channelStatusId)

{
  pointer pSVar1;
  long lVar2;
  long lVar3;
  SubscriptionStateDefn *state;
  pointer __args;
  undefined1 local_40 [16];
  
  std::recursive_mutex::lock(&this->m_adminLock);
  __args = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pSVar1 - (long)__args;
  for (lVar2 = lVar3 / 0xc0 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (__args->m_registrationId == registrationId) goto LAB_0014b845;
    if (__args[1].m_registrationId == registrationId) {
      __args = __args + 1;
      goto LAB_0014b845;
    }
    if (__args[2].m_registrationId == registrationId) {
      __args = __args + 2;
      goto LAB_0014b845;
    }
    if (__args[3].m_registrationId == registrationId) {
      __args = __args + 3;
      goto LAB_0014b845;
    }
    __args = __args + 4;
    lVar3 = lVar3 + -0x300;
  }
  lVar3 = lVar3 / 0xc0;
  if (lVar3 == 1) {
LAB_0014b821:
    if (__args->m_registrationId != registrationId) {
      __args = pSVar1;
    }
  }
  else if (lVar3 == 2) {
LAB_0014b813:
    if (__args->m_registrationId != registrationId) {
      __args = __args + 1;
      goto LAB_0014b821;
    }
  }
  else {
    if (lVar3 != 3) goto LAB_0014b8df;
    if (__args->m_registrationId != registrationId) {
      __args = __args + 1;
      goto LAB_0014b813;
    }
  }
LAB_0014b845:
  if ((__args != pSVar1) && (__args->m_status == AWAITING_MEDIA_DRIVER)) {
    __args->m_status = REGISTERED_MEDIA_DRIVER;
    std::
    make_shared<aeron::Subscription,aeron::ClientConductor&,long&,std::__cxx11::string&,int&,int&>
              ((ClientConductor *)local_40,(long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &__args->m_registrationId,(int *)__args,&__args->m_streamId);
    std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__args->m_subscriptionCache).
                super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    std::__weak_ptr<aeron::Subscription,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<aeron::Subscription,void>
              ((__weak_ptr<aeron::Subscription,(__gnu_cxx::_Lock_policy)2> *)local_40,
               &(__args->m_subscriptionCache).
                super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>);
    std::__weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__args->m_subscription).
                super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>,
               (__weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
    ::operator()(&this->m_onNewSubscriptionHandler,&__args->m_channel,__args->m_streamId,
                 registrationId);
  }
LAB_0014b8df:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onSubscriptionReady(
    std::int64_t registrationId,
    std::int32_t channelStatusId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto subIt = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (subIt != m_subscriptions.end() && (*subIt).m_status == RegistrationStatus::AWAITING_MEDIA_DRIVER)
    {
        SubscriptionStateDefn& state = (*subIt);

        state.m_status = RegistrationStatus::REGISTERED_MEDIA_DRIVER;
        state.m_subscriptionCache = std::make_shared<Subscription>(
            *this, state.m_registrationId, state.m_channel, state.m_streamId, channelStatusId);
        state.m_subscription = std::weak_ptr<Subscription>(state.m_subscriptionCache);
        m_onNewSubscriptionHandler(state.m_channel, state.m_streamId, registrationId);
        return;
    }
}